

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void absl::AtomicClearBits(atomic<long> *pv,intptr_t bits,intptr_t wait_until_clear)

{
  ulong uVar1;
  bool bVar2;
  
  do {
    do {
      uVar1 = (pv->super___atomic_base<long>)._M_i;
      if ((uVar1 & bits) == 0) {
        return;
      }
    } while ((uVar1 & wait_until_clear) != 0);
    LOCK();
    bVar2 = uVar1 == (pv->super___atomic_base<long>)._M_i;
    if (bVar2) {
      (pv->super___atomic_base<long>)._M_i = uVar1 & ~bits;
    }
    UNLOCK();
  } while (!bVar2);
  return;
}

Assistant:

static void AtomicClearBits(std::atomic<intptr_t>* pv, intptr_t bits,
                            intptr_t wait_until_clear) {
  intptr_t v;
  do {
    v = pv->load(std::memory_order_relaxed);
  } while ((v & bits) != 0 &&
           ((v & wait_until_clear) != 0 ||
            !pv->compare_exchange_weak(v, v & ~bits,
                                       std::memory_order_release,
                                       std::memory_order_relaxed)));
}